

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation.cpp
# Opt level: O0

void __thiscall
rlottie::Animation::setValue(undefined8 param_1,undefined4 param_2,AnimationImpl *param_3)

{
  pointer keypath;
  anon_class_8_1_a8c68091_conflict *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  
  keypath = std::unique_ptr<AnimationImpl,_std::default_delete<AnimationImpl>_>::operator->
                      ((unique_ptr<AnimationImpl,_std::default_delete<AnimationImpl>_> *)0x1a3abe);
  std::function<rlottie::Point(rlottie::FrameInfo_const&)>::
  function<rlottie::Animation::setValue(rlottie::Point_Type,rlottie::Property,std::__cxx11::string_const&,rlottie::Point)::__0,void>
            ((function<rlottie::Point_(const_rlottie::FrameInfo_&)> *)
             CONCAT44(param_2,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68);
  LOTVariant::LOTVariant
            ((LOTVariant *)param_3,(Property)((ulong)keypath >> 0x20),
             (PointFunc *)CONCAT44(param_2,in_stack_ffffffffffffff70));
  AnimationImpl::setValue
            (param_3,(string *)keypath,(LOTVariant *)CONCAT44(param_2,in_stack_ffffffffffffff70));
  LOTVariant::~LOTVariant((LOTVariant *)CONCAT44(param_2,in_stack_ffffffffffffff70));
  std::function<rlottie::Point_(const_rlottie::FrameInfo_&)>::~function
            ((function<rlottie::Point_(const_rlottie::FrameInfo_&)> *)0x1a3b2c);
  return;
}

Assistant:

void Animation::setValue(Point_Type, Property prop, const std::string &keypath,
                         Point value)
{
    d->setValue(keypath,
                LOTVariant(prop, [value](const FrameInfo &) { return value; }));
}